

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  ImGuiTabBar *pIVar1;
  ImVector<ImGuiTabBar> *this_00;
  int *in_RDI;
  int idx;
  undefined8 in_stack_ffffffffffffffc8;
  int i;
  ImVector<ImGuiTabBar> *in_stack_ffffffffffffffd0;
  ImGuiTabBar *in_stack_ffffffffffffffe0;
  
  i = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (in_RDI[8] == *in_RDI) {
    ImVector<ImGuiTabBar>::resize(in_stack_ffffffffffffffd0,i);
    in_RDI[8] = in_RDI[8] + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiTabBar>::operator[](in_stack_ffffffffffffffd0,i);
    in_RDI[8] = (pIVar1->Tabs).Size;
  }
  pIVar1 = ImVector<ImGuiTabBar>::operator[](in_stack_ffffffffffffffd0,i);
  this_00 = (ImVector<ImGuiTabBar> *)operator_new(0x80);
  ImGuiTabBar::ImGuiTabBar(in_stack_ffffffffffffffe0);
  pIVar1 = ImVector<ImGuiTabBar>::operator[](this_00,(int)((ulong)pIVar1 >> 0x20));
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }